

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O1

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t str_len;
  long *plVar4;
  long *plVar5;
  undefined8 *puVar6;
  int local_34;
  
  local_34 = fLI::FLAGS_v;
  str_len = strlen(module_pattern);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)vmodule_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (vmodule_list == (long *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    plVar4 = vmodule_list;
    do {
      iVar3 = std::__cxx11::string::compare((char *)plVar4);
      if (iVar3 == 0) {
        if (!bVar2) {
          local_34 = (int)plVar4[4];
          bVar2 = true;
        }
        *(int *)(plVar4 + 4) = log_level;
      }
      else if ((!bVar2) &&
              (bVar1 = glog_internal_namespace_::SafeFNMatch_
                                 ((char *)*plVar4,plVar4[1],module_pattern,str_len), bVar1)) {
        local_34 = (int)plVar4[4];
        bVar2 = true;
      }
      plVar4 = (long *)plVar4[5];
    } while (plVar4 != (long *)0x0);
  }
  if (!bVar2) {
    plVar4 = (long *)operator_new(0x30);
    *plVar4 = (long)(plVar4 + 2);
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    strlen(module_pattern);
    std::__cxx11::string::_M_replace((ulong)plVar4,0,(char *)0x0,(ulong)module_pattern);
    *(int *)(plVar4 + 4) = log_level;
    plVar4[5] = (long)vmodule_list;
    vmodule_list = plVar4;
    if (cached_site_list != (undefined8 *)0x0) {
      plVar5 = (long *)&cached_site_list;
      puVar6 = cached_site_list;
      do {
        bVar2 = glog_internal_namespace_::SafeFNMatch_
                          (module_pattern,str_len,(char *)puVar6[1],puVar6[2]);
        if (bVar2) {
          *puVar6 = plVar4 + 4;
          *plVar5 = puVar6[3];
        }
        else {
          plVar5 = puVar6 + 3;
        }
        puVar6 = (undefined8 *)*plVar5;
      } while (puVar6 != (undefined8 *)0x0);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)vmodule_mutex);
  if (SetVLOGLevel::vlocal__.level == (int32 *)0x0) {
    bVar2 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
                        ,1);
  }
  else {
    bVar2 = 0 < *SetVLOGLevel::vlocal__.level;
  }
  if (bVar2 != false) {
    RawLog__(GLOG_INFO,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
             ,199,"Set VLOG level for \"%s\" to %d",module_pattern,log_level);
  }
  return local_34;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  size_t const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    std::lock_guard<std::mutex> l(
        vmodule_mutex);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list; info != nullptr;
         info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found && SafeFNMatch_(info->module_pattern.c_str(),
                                        info->module_pattern.size(),
                                        module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      auto* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;

      SiteFlag** item_ptr = &cached_site_list;
      SiteFlag* item = cached_site_list;

      // We traverse the list fully because the pattern can match several items
      // from the list.
      while (item) {
        if (SafeFNMatch_(module_pattern, pattern_len, item->base_name,
                         item->base_len)) {
          // Redirect the cached value to its module override.
          item->level = &info->vlog_level;
          *item_ptr = item->next;  // Remove the item from the list.
        } else {
          item_ptr = &item->next;
        }
        item = *item_ptr;
      }
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}